

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O1

int fe_start_utt(fe_t *fe)

{
  vad_data_t *pvVar1;
  
  fe->num_overflow_samps = 0;
  memset(fe->overflow_samps,0,(long)fe->frame_size * 2);
  fe->pre_emphasis_prior = 0;
  pvVar1 = fe->vad_data;
  pvVar1->in_speech = '\0';
  pvVar1->pre_speech_frames = 0;
  pvVar1->post_speech_frames = 0;
  fe_prespch_reset_cep(pvVar1->prespch_buf);
  return 0;
}

Assistant:

int32
fe_start_utt(fe_t * fe)
{
    fe->num_overflow_samps = 0;
    memset(fe->overflow_samps, 0, fe->frame_size * sizeof(int16));
    fe->pre_emphasis_prior = 0;
    fe_reset_vad_data(fe->vad_data);
    return 0;
}